

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

art_ref_t art_node_erase(art_t *art,art_inner_node_t *node,art_typecode_t typecode,
                        art_key_chunk_t key_chunk)

{
  byte *pbVar1;
  uint8_t uVar2;
  short sVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  art_inner_node_t *paVar8;
  art_ref_t aVar9;
  undefined7 in_register_00000011;
  long lVar10;
  size_t i_1;
  ulong uVar11;
  long lVar12;
  art_typecode_t typecode_1;
  size_t sVar13;
  art_typecode_t aStack_40;
  
  switch((int)CONCAT71(in_register_00000011,typecode)) {
  case 2:
    bVar5 = node[1].prefix_size;
    uVar7 = 0xffffffffffffffff;
    for (uVar11 = 0; bVar5 != uVar11; uVar11 = uVar11 + 1) {
      if (node[1].prefix[uVar11] == key_chunk) {
        uVar7 = uVar11;
      }
      uVar7 = uVar7 & 0xffffffff;
    }
    uVar6 = (uint)uVar7;
    if (uVar6 != 0xffffffff) {
      if (bVar5 == 2) {
        uVar11 = uVar7 & 0xff ^ 1;
        uVar7 = *(ulong *)((long)node + uVar11 * 8 + 0x10);
        if ((uVar7 & 0xff) != 1) {
          uVar2 = node[1].prefix[uVar11];
          uVar11 = (ulong)(uint)((int)(uVar7 & 0xff) << 3);
          lVar4 = *(long *)((long)art->nodes + uVar11);
          lVar10 = (uVar7 >> 0x10) * *(long *)((long)ART_NODE_SIZES + uVar11);
          lVar12 = lVar4 + lVar10;
          pbVar1 = (byte *)(lVar4 + lVar10);
          memmove((void *)((ulong)node->prefix_size + lVar12 + 2),pbVar1 + 1,(ulong)*pbVar1);
          memcpy(pbVar1 + 1,node->prefix,(ulong)node->prefix_size);
          *(uint8_t *)((ulong)node->prefix_size + 1 + lVar12) = uVar2;
          *pbVar1 = node->prefix_size + *pbVar1 + 1;
        }
        art_node_free(art,node,'\x02');
        return uVar7;
      }
      lVar12 = (long)(int)uVar6;
      sVar13 = (size_t)(int)(~uVar6 + (uint)bVar5);
      memmove(node[1].prefix + lVar12,node[1].prefix + lVar12 + 1,sVar13);
      memmove((void *)((long)node + lVar12 * 8 + 0x10),(void *)((long)node + lVar12 * 8 + 0x18),
              sVar13 << 3);
      node[1].prefix_size = node[1].prefix_size + 0xff;
    }
    aStack_40 = '\x02';
    break;
  case 3:
    bVar5 = node[1].prefix_size;
    uVar7 = (ulong)bVar5;
    sVar13 = uVar7 * 8;
    for (uVar11 = 0; sVar13 = sVar13 - 8, uVar7 != uVar11; uVar11 = uVar11 + 1) {
      if (node[1].prefix[uVar11] == key_chunk) {
        memmove(node[1].prefix + uVar11,node[1].prefix + uVar11 + 1,~uVar11 + uVar7);
        memmove((void *)((long)node + uVar11 * 8 + 0x18),(void *)((long)node + uVar11 * 8 + 0x20),
                sVar13);
        bVar5 = node[1].prefix_size - 1;
        node[1].prefix_size = bVar5;
        break;
      }
    }
    if (bVar5 < 5) {
      paVar8 = (art_inner_node_t *)art_node4_create(art,node->prefix,node->prefix_size);
      for (lVar12 = 3; lVar12 != 7; lVar12 = lVar12 + 1) {
        art_node4_insert(art,(art_node4_t *)paVar8,*(art_ref_t *)((long)node + lVar12 * 8),
                         node->prefix[lVar12 + 3]);
      }
      art_node_free(art,node,'\x03');
      aStack_40 = '\x02';
      node = paVar8;
    }
    else {
      aStack_40 = '\x03';
    }
    break;
  case 4:
    bVar5 = node[2].prefix[(ulong)key_chunk + 3];
    if (bVar5 != 0x30) {
      node[2].prefix[(ulong)key_chunk + 3] = '0';
      *(ulong *)(node[1].prefix + 1) = *(ulong *)(node[1].prefix + 1) | 1L << (bVar5 & 0x3f);
      bVar5 = node[1].prefix_size - 1;
      node[1].prefix_size = bVar5;
      if (bVar5 < 0x11) {
        paVar8 = (art_inner_node_t *)art_node16_create(art,node->prefix,node->prefix_size);
        for (lVar12 = 0; lVar12 != 0x100; lVar12 = lVar12 + 1) {
          if ((ulong)node[2].prefix[lVar12 + 3] != 0x30) {
            art_node16_insert(art,(art_node16_t *)paVar8,
                              *(art_ref_t *)
                               ((long)node + (ulong)node[2].prefix[lVar12 + 3] * 8 + 0x110),
                              (uint8_t)lVar12);
          }
        }
        art_node_free(art,node,'\x04');
        aStack_40 = '\x03';
        node = paVar8;
        break;
      }
    }
    aStack_40 = '\x04';
    break;
  case 5:
    *(undefined8 *)((long)node + (ulong)key_chunk * 8 + 8) = 0;
    sVar3 = *(short *)(node + 1);
    *(ushort *)(node + 1) = sVar3 - 1U;
    if ((ushort)(sVar3 - 1U) < 0x31) {
      paVar8 = (art_inner_node_t *)art_node48_create(art,node->prefix,node->prefix_size);
      for (lVar12 = 0; lVar12 != 0x100; lVar12 = lVar12 + 1) {
        aVar9 = *(art_ref_t *)((long)node + lVar12 * 8 + 8);
        if (aVar9 != 0) {
          art_node48_insert(art,(art_node48_t *)paVar8,aVar9,(uint8_t)lVar12);
        }
      }
      art_node_free(art,node,'\x05');
      aStack_40 = '\x04';
      node = paVar8;
    }
    else {
      aStack_40 = '\x05';
    }
    break;
  default:
    return 0;
  }
  aVar9 = art_get_ref(art,node,aStack_40);
  return aVar9;
}

Assistant:

static art_ref_t art_node_erase(art_t *art, art_inner_node_t *node,
                                art_typecode_t typecode,
                                art_key_chunk_t key_chunk) {
    switch (typecode) {
        case CROARING_ART_NODE4_TYPE:
            return art_node4_erase(art, (art_node4_t *)node, key_chunk);
        case CROARING_ART_NODE16_TYPE:
            return art_node16_erase(art, (art_node16_t *)node, key_chunk);
        case CROARING_ART_NODE48_TYPE:
            return art_node48_erase(art, (art_node48_t *)node, key_chunk);
        case CROARING_ART_NODE256_TYPE:
            return art_node256_erase(art, (art_node256_t *)node, key_chunk);
        default:
            assert(false);
            return CROARING_ART_NULL_REF;
    }
}